

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

void bn_mod_inverse_speed(void *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  BIGNUM *ret;
  BN_CTX *ctx_00;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  long in_RDI;
  int i_1;
  int i;
  int64_t end_time;
  int64_t start_time;
  uint32_t ticks_hi;
  uint32_t ticks_lo;
  uint32_t start_tick_hi;
  uint32_t start_tick_lo;
  double usec;
  TEST_ARGS *args;
  int N;
  BN_CTX *ctx;
  BIGNUM *b;
  BIGNUM *in_stack_00000068;
  BIGNUM *in_stack_00000070;
  BIGNUM *in_stack_00000078;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  
  iVar3 = (int)*(undefined8 *)(in_RDI + 8);
  if (bn_mod_inverse_speed::order == (BIGNUM *)0x0) {
    bn_mod_inverse_speed::order = (BIGNUM *)BN_new();
    BN_bin2bn(gn,0x20,(BIGNUM *)bn_mod_inverse_speed::order);
  }
  bn_mod_inverse_speed::a = (BIGNUM *)BN_new();
  ret = BN_new();
  ctx_00 = BN_CTX_new();
  random_string((uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff9c);
  BN_bin2bn(in,0x20,(BIGNUM *)bn_mod_inverse_speed::a);
  uVar1 = rdtsc();
  iVar4 = gettime_i64();
  for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
    BN_mod_inverse(ret,(BIGNUM *)bn_mod_inverse_speed::a,(BIGNUM *)bn_mod_inverse_speed::order,
                   ctx_00);
  }
  uVar2 = rdtsc();
  iVar5 = gettime_i64();
  printf("--------------MOD INVERSE SPEED TEST--------------- \n");
  lVar6 = CONCAT44(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) -
                   (uint)((uint)uVar2 < (uint)uVar1),(uint)uVar2 - (uint)uVar1);
  printf("average cycles per op : %d \n",lVar6 / (long)iVar3 & 0xffffffff,lVar6 % (long)iVar3);
  printf("binary exgcd: %d  op/s\n\n",
         (ulong)(uint)(int)(((double)iVar3 * 1000000.0) / (double)(iVar5 - iVar4)));
  uVar1 = rdtsc();
  iVar4 = gettime_i64();
  for (local_58 = 0; local_58 < iVar3; local_58 = local_58 + 1) {
    BN_mod_inverse_Lehmer(in_stack_00000078,in_stack_00000070,in_stack_00000068,(BN_CTX *)p);
  }
  uVar2 = rdtsc();
  iVar5 = gettime_i64();
  lVar6 = CONCAT44(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) -
                   (uint)((uint)uVar2 < (uint)uVar1),(uint)uVar2 - (uint)uVar1);
  printf("average cycles per op : %d \n",lVar6 / (long)iVar3 & 0xffffffff,lVar6 % (long)iVar3);
  printf("lehmer exgcd: %d  op/s\n\n",
         (ulong)(uint)(int)(((double)iVar3 * 1000000.0) / (double)(iVar5 - iVar4)));
  return;
}

Assistant:

static void bn_mod_inverse_speed(void *p)
{
    static BIGNUM *order = NULL;
    static BIGNUM *a = NULL;
    BIGNUM *b = NULL;
    BN_CTX *ctx = NULL;
    int N;
    TEST_ARGS *args = (TEST_ARGS*)p;
    N = args->N;

    if(!order)
    {
        order = BN_new();
        BN_bin2bn(gn, 32, order);
    }
    a = BN_new();
    b = BN_new();
    ctx = BN_CTX_new();
    double usec;

    random_string(in, 32);
    BN_bin2bn(in, 32, a);

    /* binary gcd */
    BENCH_VARS;
    COUNTER_START();
    TIMER_START();

    for (int i = 0; i < N; i++)
        BN_mod_inverse(b, a, order, ctx);

    COUNTER_STOP();
    TIMER_STOP();

    usec = USEC();

    printf("--------------MOD INVERSE SPEED TEST--------------- \n");
    printf("average cycles per op : %d \n", (int)(TICKS()/N));
    printf("binary exgcd: %d  op/s\n\n", (int)((double)N*1000000/usec));

    /* lehmer gcd */
    COUNTER_START();
    TIMER_START();

    for (int i = 0; i < N; i++)
        BN_mod_inverse_Lehmer(b, a, order, ctx);

    COUNTER_STOP();
    TIMER_STOP();
    
    usec = USEC();

    printf("average cycles per op : %d \n", (int)(TICKS()/N));
    printf("lehmer exgcd: %d  op/s\n\n", (int)((double)N*1000000/usec));
}